

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_unittests.cpp
# Opt level: O3

void __thiscall Matrix_Inverse_Test::~Matrix_Inverse_Test(Matrix_Inverse_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Matrix, Inverse) {
  Matrix<double> m(5, 5);

  for (size_t i = 0; i < m.get_rows(); ++i) {
    for (size_t j = 0; j < m.get_columns(); ++j) {
      m[i][j] = 1 + (i * j) % 7;
    }
  }

  Matrix<double> I(5, 5);
  for (size_t i = 0; i < m.get_rows(); ++i) {
    I[i][i] = 1.;
  }

  auto i = m.Inverse();
  EXPECT_EQ(I, i * m);
  EXPECT_EQ(I, m * i);
  EXPECT_EQ(m * i, i * m);
}